

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::ZoneStackBase::_prepareBlock
          (ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  ZoneAllocator *this_00;
  Block *pBVar1;
  Block *pBVar2;
  void *pvVar3;
  size_t local_30;
  
  this_00 = this->_allocator;
  if (this_00 == (ZoneAllocator *)0x0) {
    _prepareBlock();
  }
  else {
    pBVar1 = this->_block[side];
    if (pBVar1->_start != pBVar1->_end) {
      if (this_00->_zone != (Zone *)0x0) {
        pBVar2 = (Block *)ZoneAllocator::_alloc(this_00,0x200,&local_30);
        if (pBVar2 == (Block *)0x0) {
          return 1;
        }
        pBVar2->_link[side] = (Block *)0x0;
        pBVar2->_link[side == 0] = pBVar1;
        pvVar3 = (void *)((long)pBVar2->_link + initialIndex);
        pBVar2->_start = pvVar3;
        pBVar2->_end = pvVar3;
        pBVar1->_link[side] = pBVar2;
        this->_block[side] = pBVar2;
        return 0;
      }
      goto LAB_00129db6;
    }
  }
  _prepareBlock();
LAB_00129db6:
  _prepareBlock();
  return 1;
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}